

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O1

void chaiscript::bootstrap::Bootstrap::bootstrap(Module *m)

{
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  *this_00;
  type_info *ptVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  initializer_list<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_> __l_00;
  initializer_list<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  allocator_type local_118a;
  undefined1 local_1189;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1188;
  undefined1 local_1178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1168 [2];
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1148;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1118;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10e8;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10b8;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1088;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1058;
  string local_1028;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1008;
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ff8;
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_fe0;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_fc8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_fa0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f90;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f80;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f70;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f60;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f50;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f40;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f30;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f20;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f10;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f00;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ef0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ee0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ed0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ec0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_eb0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ea0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e90;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e80;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e70;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e60;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e50;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e40;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e30;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e20;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e10;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e00;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_df0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_de0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_dd0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_dc0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_db0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_da0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d90;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d80;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d70;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d60;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d50;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d40;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d30;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d20;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d10;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d00;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_cf0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ce0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_cd0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_cc0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_cb0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ca0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c90;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c80;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c70;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c60;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c50;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c40;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c30;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c20;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c10;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c00;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_bf0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_be0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_bd0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_bc0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_bb0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ba0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_b90;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_b80;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_b70;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_b60;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_b50;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_b40;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  code *local_2c0;
  undefined8 local_2b8;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_2b0;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_270;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_260;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_1b0;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_1a0;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined8 local_60;
  undefined8 local_58;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"void","");
  local_1178._0_8_ = &void::typeinfo;
  local_1178._8_8_ = &void::typeinfo;
  local_1168[0]._M_allocated_capacity._0_4_ = 8;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1178,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"bool","");
  local_1178._0_8_ = &bool::typeinfo;
  local_1178._8_8_ = &bool::typeinfo;
  local_1168[0]._M_allocated_capacity._0_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1178,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Object","");
  local_1178._0_8_ = &Boxed_Value::typeinfo;
  local_1178._8_8_ = &Boxed_Value::typeinfo;
  local_1168[0]._M_allocated_capacity._0_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1178,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Number","");
  local_1178._0_8_ = &Boxed_Number::typeinfo;
  local_1178._8_8_ = &Boxed_Number::typeinfo;
  local_1168[0]._M_allocated_capacity._0_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1178,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Function","");
  local_1178._0_8_ = &std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::typeinfo;
  local_1178._8_8_ = &dispatch::Proxy_Function_Base::typeinfo;
  local_1168[0]._M_allocated_capacity._0_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1178,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Assignable_Function","");
  local_1178._0_8_ = &dispatch::Assignable_Proxy_Function::typeinfo;
  local_1178._8_8_ = &dispatch::Assignable_Proxy_Function::typeinfo;
  local_1168[0]._M_allocated_capacity._0_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1178,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"exception","");
  local_1178._0_8_ = &std::exception::typeinfo;
  local_1178._8_8_ = &std::exception::typeinfo;
  local_1168[0]._M_allocated_capacity._0_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1178,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  local_1178._0_8_ = dispatch::Proxy_Function_Base::get_arity;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<int(chaiscript::dispatch::Proxy_Function_Base::*)()noexcept_const,true,true,false,false,int,chaiscript::dispatch::Proxy_Function_Base_const&>
            (&local_b30);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"get_arity","");
  this = &m->m_funcs;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_b30,&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if (local_b30.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b30.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = (type_info *)0x11;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::dispatch::Proxy_Function_Base::*)(chaiscript::dispatch::Proxy_Function_Base_const&)noexcept_const,true,true,false,false,bool,chaiscript::dispatch::Proxy_Function_Base_const&,chaiscript::dispatch::Proxy_Function_Base_const&>
            (&local_b40);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"==","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_b40,&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if (local_b40.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b40.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = dispatch::Proxy_Function_Base::get_param_types;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::Bootstrap::return_boxed_value_vector<std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>const&(chaiscript::dispatch::Proxy_Function_Base::*)()noexcept_const>(std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>const&(chaiscript::dispatch::Proxy_Function_Base::*const&)()noexcept_const)::_lambda(chaiscript::dispatch::Proxy_Function_Base_const*)_1_,false,false,false,true,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,chaiscript::dispatch::Proxy_Function_Base_const*>
            (&local_b50);
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"get_param_types","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_b50,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if (local_b50.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b50.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = (type_info *)0x29;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::Bootstrap::return_boxed_value_vector<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>(chaiscript::dispatch::Proxy_Function_Base::*)()const>(std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>(chaiscript::dispatch::Proxy_Function_Base::*const&)()const)::_lambda(chaiscript::dispatch::Proxy_Function_Base_const*)_1_,false,false,false,true,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,chaiscript::dispatch::Proxy_Function_Base_const*>
            (&local_b60);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"get_contained_functions","")
  ;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_b60,&local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if (local_b60.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b60.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(std::exception_const&)_1_,false,false,false,true,std::__cxx11::string,std::exception_const&>
            (&local_b70,local_1178);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"what","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_b70,&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if (local_b70.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"out_of_range","");
  local_1178._0_8_ = &std::out_of_range::typeinfo;
  local_1178._8_8_ = &std::out_of_range::typeinfo;
  local_1168[0]._M_allocated_capacity._0_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1178,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"logic_error","");
  local_1178._0_8_ = &std::logic_error::typeinfo;
  local_1178._8_8_ = &std::logic_error::typeinfo;
  local_1168[0]._M_allocated_capacity._0_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1178,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  base_class<std::exception,std::logic_error>();
  this_00 = &m->m_conversions;
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_190);
  if (local_190.
      super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.
               super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  base_class<std::logic_error,std::out_of_range>();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_1a0);
  if (local_1a0.
      super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a0.
               super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  base_class<std::exception,std::out_of_range>();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_1b0);
  if (local_1b0.
      super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.
               super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"runtime_error","");
  local_1178._0_8_ = &std::runtime_error::typeinfo;
  local_1178._8_8_ = &std::runtime_error::typeinfo;
  local_1168[0]._M_allocated_capacity._0_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1178,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  base_class<std::exception,std::runtime_error>();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_1e0);
  if (local_1e0.
      super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e0.
               super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  dispatch::detail::build_constructor_<std::runtime_error,std::__cxx11::string_const&>
            ((_func_runtime_error_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)&local_b80);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"runtime_error","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_b80,&local_380);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if (local_b80.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b80.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Dynamic_Object","");
  local_1178._0_8_ = &dispatch::Dynamic_Object::typeinfo;
  local_1178._8_8_ = &dispatch::Dynamic_Object::typeinfo;
  local_1168[0]._M_allocated_capacity._0_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1178,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  dispatch::detail::
  build_constructor_<chaiscript::dispatch::Dynamic_Object,std::__cxx11::string_const&>
            ((_func_Dynamic_Object_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)&local_b90);
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"Dynamic_Object","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_b90,&local_3a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if (local_b90.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b90.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  dispatch::detail::build_constructor_<chaiscript::dispatch::Dynamic_Object>
            ((_func_Dynamic_Object *)&local_ba0);
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Dynamic_Object","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ba0,&local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if (local_ba0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ba0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = dispatch::Dynamic_Object::get_type_name_abi_cxx11_;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string_const&(chaiscript::dispatch::Dynamic_Object::*)()noexcept_const,true,true,false,false,std::__cxx11::string_const&,chaiscript::dispatch::Dynamic_Object_const&>
            (&local_bb0);
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"get_type_name","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_bb0,&local_3e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if (local_bb0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_bb0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = dispatch::Dynamic_Object::get_attrs_abi_cxx11_;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>(chaiscript::dispatch::Dynamic_Object::*)()const,false,true,false,false,std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>,chaiscript::dispatch::Dynamic_Object_const&>
            (&local_bc0);
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"get_attrs","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_bc0,&local_400);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if (local_bc0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_bc0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = dispatch::Dynamic_Object::set_explicit;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<void(chaiscript::dispatch::Dynamic_Object::*)(bool)noexcept,true,true,false,false,void,chaiscript::dispatch::Dynamic_Object&,bool>
            (&local_bd0);
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"set_explicit","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_bd0,&local_420);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if (local_bd0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_bd0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = dispatch::Dynamic_Object::is_explicit;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::dispatch::Dynamic_Object::*)()noexcept_const,true,true,false,false,bool,chaiscript::dispatch::Dynamic_Object_const&>
            (&local_be0);
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"is_explicit","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_be0,&local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if (local_be0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_be0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = dispatch::Dynamic_Object::has_attr;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const,false,true,false,false,bool,chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&>
            (&local_bf0);
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"has_attr","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_bf0,&local_460);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if (local_bf0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_bf0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = dispatch::Dynamic_Object::get_attr;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&),false,true,false,false,chaiscript::Boxed_Value&,chaiscript::dispatch::Dynamic_Object&,std::__cxx11::string_const&>
            (&local_c00);
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"get_attr","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c00,&local_480);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if (local_c00.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c00.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = dispatch::Dynamic_Object::get_attr;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value_const&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const,false,true,false,false,chaiscript::Boxed_Value_const&,chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&>
            (&local_c10);
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"get_attr","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c10,&local_4a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  if (local_c10.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c10.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = dispatch::Dynamic_Object::method_missing;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&),false,true,false,false,chaiscript::Boxed_Value&,chaiscript::dispatch::Dynamic_Object&,std::__cxx11::string_const&>
            (&local_c20);
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"method_missing","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c20,&local_4c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  if (local_c20.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c20.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = dispatch::Dynamic_Object::method_missing;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value_const&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const,false,true,false,false,chaiscript::Boxed_Value_const&,chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&>
            (&local_c30);
  local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"method_missing","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c30,&local_4e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  if (local_c30.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c30.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = dispatch::Dynamic_Object::get_attr;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&),false,true,false,false,chaiscript::Boxed_Value&,chaiscript::dispatch::Dynamic_Object&,std::__cxx11::string_const&>
            (&local_c40);
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"[]","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c40,&local_500);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_c40.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c40.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = dispatch::Dynamic_Object::get_attr;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value_const&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const,false,true,false,false,chaiscript::Boxed_Value_const&,chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&>
            (&local_c50);
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"[]","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c50,&local_520);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if (local_c50.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c50.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,
             "\n          def Dynamic_Object::clone() {\n            auto &new_o = Dynamic_Object(this.get_type_name());\n            for_each(this.get_attrs(), fun[new_o](x) { new_o.get_attr(x.first) = x.second; } );\n            new_o;\n          }\n\n          def `=`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()\n          {\n            for_each(rhs.get_attrs(), fun[lhs](x) { lhs.get_attr(x.first) = clone(x.second); } );\n          }\n\n          def `!=`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()\n          {\n            var rhs_attrs := rhs.get_attrs();\n            var lhs_attrs := lhs.get_attrs();\n\n            if (rhs_attrs.size() != lhs_attrs.size()) {\n              true;\n            } else {\n              return any_of(rhs_attrs, fun[lhs](x) { !lhs.has_attr(x.first) || lhs.get_attr(x.first) != x.second; } );\n            }\n          }\n\n          def `==`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()\n          {\n            var rhs_attrs := rhs.get_attrs();\n            var lhs_attrs := lhs.get_attrs();\n\n            if (rhs_attrs.size() != lhs_attrs.size()) {\n              false;\n            } else {\n              return all_of(rhs_attrs, fun[lhs](x) { lhs.has_attr(x.first) && lhs.get_attr(x.first) == x.second; } );\n            }\n          }\n        "
             ,"");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&m->m_evals,
             &local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  local_1178._0_8_ = has_guard;
  dispatch::detail::
  make_callable_impl<bool(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)noexcept,true,false,false,false,bool,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            (&local_c60);
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"has_guard","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c60,&local_540);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if (local_c60.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c60.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = get_guard;
  dispatch::detail::
  make_callable_impl<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),false,false,false,false,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            (&local_c70);
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"get_guard","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c70,&local_560);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  if (local_c70.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c70.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Boxed_Value::is_undef;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,bool,chaiscript::Boxed_Value_const&>
            (&local_c80);
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"is_var_undef","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c80,&local_580);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  if (local_c80.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c80.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Boxed_Value::is_null;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,bool,chaiscript::Boxed_Value_const&>
            (&local_c90);
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"is_var_null","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c90,&local_5a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  if (local_c90.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c90.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Boxed_Value::is_const;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,bool,chaiscript::Boxed_Value_const&>
            (&local_ca0);
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"is_var_const","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ca0,&local_5c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  if (local_ca0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ca0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Boxed_Value::is_ref;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,bool,chaiscript::Boxed_Value_const&>
            (&local_cb0);
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"is_var_reference","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_cb0,&local_5e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
  }
  if (local_cb0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cb0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Boxed_Value::is_pointer;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,bool,chaiscript::Boxed_Value_const&>
            (&local_cc0);
  local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"is_var_pointer","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_cc0,&local_600);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_600._M_dataplus._M_p != &local_600.field_2) {
    operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
  }
  if (local_cc0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cc0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Boxed_Value::is_return_value;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,bool,chaiscript::Boxed_Value_const&>
            (&local_cd0);
  local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"is_var_return_value","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_cd0,&local_620);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620._M_dataplus._M_p != &local_620.field_2) {
    operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
  }
  if (local_cd0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cd0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Boxed_Value::reset_return_value;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<void(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,void,chaiscript::Boxed_Value_const&>
            (&local_ce0);
  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"reset_var_return_value","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ce0,&local_640);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  if (local_ce0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ce0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Boxed_Value::is_type;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Boxed_Value::*)(chaiscript::Type_Info_const&)noexcept_const,true,true,false,false,bool,chaiscript::Boxed_Value_const&,chaiscript::Type_Info_const&>
            (&local_cf0);
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"is_type","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_cf0,&local_660);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
  }
  if (local_cf0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cf0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Boxed_Value::get_attr;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value(chaiscript::Boxed_Value::*)(std::__cxx11::string_const&),false,true,false,false,chaiscript::Boxed_Value,chaiscript::Boxed_Value&,std::__cxx11::string_const&>
            (&local_d00);
  local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_680,"get_var_attr","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d00,&local_680);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_680._M_dataplus._M_p != &local_680.field_2) {
    operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
  }
  if (local_d00.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d00.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Boxed_Value::copy_attrs;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value&(chaiscript::Boxed_Value::*)(chaiscript::Boxed_Value_const&),false,true,false,false,chaiscript::Boxed_Value&,chaiscript::Boxed_Value&,chaiscript::Boxed_Value_const&>
            (&local_d10);
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"copy_var_attrs","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d10,&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if (local_d10.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d10.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Boxed_Value::clone_attrs;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value&(chaiscript::Boxed_Value::*)(chaiscript::Boxed_Value_const&),false,true,false,false,chaiscript::Boxed_Value&,chaiscript::Boxed_Value&,chaiscript::Boxed_Value_const&>
            (&local_d20);
  local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"clone_var_attrs","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d20,&local_6c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
    operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
  }
  if (local_d20.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d20.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Boxed_Value::get_type_info;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Type_Info_const&(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,chaiscript::Type_Info_const&,chaiscript::Boxed_Value_const&>
            (&local_d30);
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"get_type_info","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d30,&local_6e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  if (local_d30.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d30.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Type_Info","");
  local_1178._0_8_ = &Type_Info::typeinfo;
  local_1178._8_8_ = &Type_Info::typeinfo;
  local_1168[0]._M_allocated_capacity._0_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1178,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  dispatch::detail::build_constructor_<chaiscript::Type_Info,chaiscript::Type_Info_const&>
            ((_func_Type_Info_Type_Info_ptr *)&local_d40);
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,"Type_Info","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d40,&local_700);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
  }
  if (local_d40.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d40.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  operators::equal<chaiscript::Type_Info>(m);
  local_1178._0_8_ = Type_Info::is_const;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,bool,chaiscript::Type_Info_const&>
            (&local_d50);
  local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"is_type_const","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d50,&local_720);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720._M_dataplus._M_p != &local_720.field_2) {
    operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
  }
  if (local_d50.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d50.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Type_Info::is_reference;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,bool,chaiscript::Type_Info_const&>
            (&local_d60);
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"is_type_reference","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d60,&local_740);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
  }
  if (local_d60.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d60.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Type_Info::is_void;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,bool,chaiscript::Type_Info_const&>
            (&local_d70);
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"is_type_void","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d70,&local_760);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
  }
  if (local_d70.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d70.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Type_Info::is_undef;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,bool,chaiscript::Type_Info_const&>
            (&local_d80);
  local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"is_type_undef","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d80,&local_780);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._M_dataplus._M_p != &local_780.field_2) {
    operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
  }
  if (local_d80.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d80.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Type_Info::is_pointer;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,bool,chaiscript::Type_Info_const&>
            (&local_d90);
  local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a0,"is_type_pointer","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d90,&local_7a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
    operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
  }
  if (local_d90.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d90.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Type_Info::is_arithmetic;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,bool,chaiscript::Type_Info_const&>
            (&local_da0);
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"is_type_arithmetic","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_da0,&local_7c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
    operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
  }
  if (local_da0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_da0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Type_Info::name;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<char_const*(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,char_const*,chaiscript::Type_Info_const&>
            (&local_db0);
  local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e0,"cpp_name","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_db0,&local_7e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
    operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
  }
  if (local_db0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_db0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Type_Info::bare_name;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<char_const*(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,char_const*,chaiscript::Type_Info_const&>
            (&local_dc0);
  local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"cpp_bare_name","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_dc0,&local_800);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800._M_dataplus._M_p != &local_800.field_2) {
    operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
  }
  if (local_dc0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_dc0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Type_Info::bare_equal;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Type_Info::*)(chaiscript::Type_Info_const&)noexcept_const,true,true,false,false,bool,chaiscript::Type_Info_const&,chaiscript::Type_Info_const&>
            (&local_dd0);
  local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"bare_equal","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_dd0,&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
  }
  if (local_dd0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_dd0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  ptVar1 = (type_info *)(local_1178 + 0x10);
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"bool","");
  basic_constructors<bool>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  operators::assign<bool>(m);
  operators::equal<bool>(m);
  operators::not_equal<bool>(m);
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(std::__cxx11::string_const&)_1_,false,false,false,true,std::__cxx11::string,std::__cxx11::string_const&>
            (&local_de0,local_1178);
  local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_840,"to_string","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_de0,&local_840);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._M_dataplus._M_p != &local_840.field_2) {
    operator_delete(local_840._M_dataplus._M_p,local_840.field_2._M_allocated_capacity + 1);
  }
  if (local_de0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_de0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(bool)_1_,false,false,false,true,std::__cxx11::string,bool>
            (&local_df0,local_1178);
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_860,"to_string","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_df0,&local_860);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
  }
  if (local_df0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_df0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = unknown_assign;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,chaiscript::Boxed_Value),false,false,false,false,chaiscript::Boxed_Value,chaiscript::Boxed_Value,chaiscript::Boxed_Value>
            (&local_e00);
  local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_880,"=","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e00,&local_880);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880._M_dataplus._M_p != &local_880.field_2) {
    operator_delete(local_880._M_dataplus._M_p,local_880.field_2._M_allocated_capacity + 1);
  }
  if (local_e00.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e00.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::Boxed_Value_const&)_1_,false,false,false,true,void,chaiscript::Boxed_Value_const&>
            (&local_e10,local_1178);
  local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a0,"throw","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e10,&local_8a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
    operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
  }
  if (local_e10.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e10.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(char)_1_,false,false,false,true,std::__cxx11::string,char>
            (&local_e20,local_1178);
  local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c0,"to_string","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e20,&local_8c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
    operator_delete(local_8c0._M_dataplus._M_p,local_8c0.field_2._M_allocated_capacity + 1);
  }
  if (local_e20.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e20.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Boxed_Number::to_string_abi_cxx11_;
  local_1178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string(chaiscript::Boxed_Number::*)()const,false,true,false,false,std::__cxx11::string,chaiscript::Boxed_Number_const&>
            (&local_e30);
  local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e0,"to_string","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e30,&local_8e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
    operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
  }
  if (local_e30.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e30.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"double","");
  bootstrap_pod_type<double>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"long_double","");
  bootstrap_pod_type<long_double>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"float","");
  bootstrap_pod_type<float>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"int","");
  bootstrap_pod_type<int>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"long","");
  bootstrap_pod_type<long>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"unsigned_int","");
  bootstrap_pod_type<unsigned_int>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"unsigned_long","");
  bootstrap_pod_type<unsigned_long>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"long_long","");
  bootstrap_pod_type<long_long>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"unsigned_long_long","");
  bootstrap_pod_type<unsigned_long_long>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"size_t","");
  bootstrap_pod_type<unsigned_long>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"char","");
  bootstrap_pod_type<char>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"wchar_t","");
  bootstrap_pod_type<wchar_t>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"char16_t","");
  bootstrap_pod_type<char16_t>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"char32_t","");
  bootstrap_pod_type<char32_t>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"int8_t","");
  bootstrap_pod_type<signed_char>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"int16_t","");
  bootstrap_pod_type<short>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"int32_t","");
  bootstrap_pod_type<int>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"int64_t","");
  bootstrap_pod_type<long>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"uint8_t","");
  bootstrap_pod_type<unsigned_char>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"uint16_t","");
  bootstrap_pod_type<unsigned_short>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"uint32_t","");
  bootstrap_pod_type<unsigned_int>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  local_1178._0_8_ = ptVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1178,"uint64_t","");
  bootstrap_pod_type<unsigned_long>((string *)local_1178,m);
  if ((type_info *)local_1178._0_8_ != ptVar1) {
    operator_delete((void *)local_1178._0_8_,
                    CONCAT44(local_1168[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1168[0]._M_allocated_capacity) + 1);
  }
  operators::logical_compliment<bool>(m);
  opers_arithmetic_pod(m);
  local_1178._0_8_ = Build_Info::version_major;
  dispatch::detail::make_callable_impl<int(*)()noexcept,true,false,false,false,int>(&local_e40);
  local_900._M_dataplus._M_p = (pointer)&local_900.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_900,"version_major","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e40,&local_900);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900._M_dataplus._M_p != &local_900.field_2) {
    operator_delete(local_900._M_dataplus._M_p,local_900.field_2._M_allocated_capacity + 1);
  }
  if (local_e40.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e40.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Build_Info::version_minor;
  dispatch::detail::make_callable_impl<int(*)()noexcept,true,false,false,false,int>(&local_e50);
  local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_920,"version_minor","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e50,&local_920);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920._M_dataplus._M_p != &local_920.field_2) {
    operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
  }
  if (local_e50.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e50.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Build_Info::version_patch;
  dispatch::detail::make_callable_impl<int(*)()noexcept,true,false,false,false,int>(&local_e60);
  local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_940,"version_patch","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e60,&local_940);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940._M_dataplus._M_p != &local_940.field_2) {
    operator_delete(local_940._M_dataplus._M_p,local_940.field_2._M_allocated_capacity + 1);
  }
  if (local_e60.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e60.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Build_Info::version_abi_cxx11_;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string(*)(),false,false,false,false,std::__cxx11::string>
            (&local_e70);
  local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"version","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e70,&local_960);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_960._M_dataplus._M_p != &local_960.field_2) {
    operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
  }
  if (local_e70.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e70.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Build_Info::compiler_version_abi_cxx11_;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string(*)(),false,false,false,false,std::__cxx11::string>
            (&local_e80);
  local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_980,"compiler_version","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e80,&local_980);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_980._M_dataplus._M_p != &local_980.field_2) {
    operator_delete(local_980._M_dataplus._M_p,local_980.field_2._M_allocated_capacity + 1);
  }
  if (local_e80.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e80.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Build_Info::compiler_name_abi_cxx11_;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string(*)(),false,false,false,false,std::__cxx11::string>
            (&local_e90);
  local_9a0._M_dataplus._M_p = (pointer)&local_9a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a0,"compiler_name","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e90,&local_9a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a0._M_dataplus._M_p != &local_9a0.field_2) {
    operator_delete(local_9a0._M_dataplus._M_p,local_9a0.field_2._M_allocated_capacity + 1);
  }
  if (local_e90.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e90.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Build_Info::compiler_id_abi_cxx11_;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string(*)(),false,false,false,false,std::__cxx11::string>
            (&local_ea0);
  local_9c0._M_dataplus._M_p = (pointer)&local_9c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c0,"compiler_id","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ea0,&local_9c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0._M_dataplus._M_p != &local_9c0.field_2) {
    operator_delete(local_9c0._M_dataplus._M_p,local_9c0.field_2._M_allocated_capacity + 1);
  }
  if (local_ea0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ea0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Build_Info::debug_build;
  dispatch::detail::make_callable_impl<bool(*)()noexcept,true,false,false,false,bool>(&local_eb0);
  local_9e0._M_dataplus._M_p = (pointer)&local_9e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e0,"debug_build","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_eb0,&local_9e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
    operator_delete(local_9e0._M_dataplus._M_p,local_9e0.field_2._M_allocated_capacity + 1);
  }
  if (local_eb0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_eb0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = print;
  dispatch::detail::
  make_callable_impl<void(*)(std::__cxx11::string_const&)noexcept,true,false,false,false,void,std::__cxx11::string_const&>
            (&local_ec0);
  local_a00._M_dataplus._M_p = (pointer)&local_a00.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a00,"print_string","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ec0,&local_a00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
    operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
  }
  if (local_ec0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ec0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = println;
  dispatch::detail::
  make_callable_impl<void(*)(std::__cxx11::string_const&)noexcept,true,false,false,false,void,std::__cxx11::string_const&>
            (&local_ed0);
  local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a20,"println_string","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ed0,&local_a20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
  }
  if (local_ed0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ed0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = bind_function;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value(*)(chaiscript::Function_Params_const&)>,chaiscript::Boxed_Value(*)(chaiscript::Function_Params_const&)>
            ((chaiscript *)&local_ee0,(_func_Boxed_Value_Function_Params_ptr **)local_1178);
  local_a40._M_dataplus._M_p = (pointer)&local_a40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a40,"bind","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ee0,&local_a40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
    operator_delete(local_a40._M_dataplus._M_p,local_a40.field_2._M_allocated_capacity + 1);
  }
  if (local_ee0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ee0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = shared_ptr_unconst_clone<chaiscript::dispatch::Proxy_Function_Base>;
  dispatch::detail::
  make_callable_impl<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),false,false,false,false,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            (&local_ef0);
  local_a60._M_dataplus._M_p = (pointer)&local_a60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a60,"clone","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ef0,&local_a60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._M_dataplus._M_p != &local_a60.field_2) {
    operator_delete(local_a60._M_dataplus._M_p,local_a60.field_2._M_allocated_capacity + 1);
  }
  if (local_ef0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ef0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = ptr_assign<chaiscript::dispatch::Proxy_Function_Base>;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&),false,false,false,false,chaiscript::Boxed_Value,chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&>
            (&local_f00);
  local_a80._M_dataplus._M_p = (pointer)&local_a80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a80,"=","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_f00,&local_a80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
  }
  if (local_f00.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f00.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = ptr_assign<chaiscript::dispatch::Proxy_Function_Base_const>;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),false,false,false,false,chaiscript::Boxed_Value,chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            (&local_f10);
  local_aa0._M_dataplus._M_p = (pointer)&local_aa0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_aa0,"=","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_f10,&local_aa0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if (local_f10.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f10.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  base_class<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Assignable_Proxy_Function>
            ();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_250);
  if (local_250.
      super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_250.
               super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::dispatch::Assignable_Proxy_Function&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)_1_,false,false,false,true,void,chaiscript::dispatch::Assignable_Proxy_Function&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            (&local_f20,local_1178);
  local_ac0._M_dataplus._M_p = (pointer)&local_ac0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac0,"=","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_f20,&local_ac0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._M_dataplus._M_p != &local_ac0.field_2) {
    operator_delete(local_ac0._M_dataplus._M_p,local_ac0.field_2._M_allocated_capacity + 1);
  }
  if (local_f20.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f20.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = Boxed_Value::type_match;
  dispatch::detail::
  make_callable_impl<bool(*)(chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)noexcept,true,false,false,false,bool,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&>
            (&local_f30);
  local_ae0._M_dataplus._M_p = (pointer)&local_ae0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ae0,"type_match","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_f30,&local_ae0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae0._M_dataplus._M_p != &local_ae0.field_2) {
    operator_delete(local_ae0._M_dataplus._M_p,local_ae0.field_2._M_allocated_capacity + 1);
  }
  if (local_f30.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f30.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = has_parse_tree;
  dispatch::detail::
  make_callable_impl<bool(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)noexcept,true,false,false,false,bool,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            (&local_f40);
  local_b00._M_dataplus._M_p = (pointer)&local_b00.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b00,"has_parse_tree","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_f40,&local_b00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b00._M_dataplus._M_p != &local_b00.field_2) {
    operator_delete(local_b00._M_dataplus._M_p,local_b00.field_2._M_allocated_capacity + 1);
  }
  if (local_f40.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f40.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_1178._0_8_ = get_parse_tree;
  dispatch::detail::
  make_callable_impl<chaiscript::AST_Node_const&(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),false,false,false,false,chaiscript::AST_Node_const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            (&local_f50);
  local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b20,"get_parse_tree","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_f50,&local_b20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b20._M_dataplus._M_p != &local_b20.field_2) {
    operator_delete(local_b20._M_dataplus._M_p,local_b20.field_2._M_allocated_capacity + 1);
  }
  if (local_f50.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f50.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  base_class<std::runtime_error,chaiscript::exception::eval_error>();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_260);
  if (local_260.
      super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_260.
               super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  base_class<std::exception,chaiscript::exception::eval_error>();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_270);
  if (local_270.
      super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.
               super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"arithmetic_error","");
  local_1178._0_8_ = &exception::arithmetic_error::typeinfo;
  local_1178._8_8_ = &exception::arithmetic_error::typeinfo;
  local_1168[0]._M_allocated_capacity._0_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1178,&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  base_class<std::runtime_error,chaiscript::exception::arithmetic_error>();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_2a0);
  if (local_2a0.
      super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2a0.
               super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  base_class<std::exception,chaiscript::exception::arithmetic_error>();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_2b0);
  if (local_2b0.
      super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.
               super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  paVar2 = &local_1028.field_2;
  local_1028._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1028,"eval_error","");
  local_fc8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_fc8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_fc8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f90.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x10;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string_chaiscript::exception::eval_error::*,true,true,true,false,std::__cxx11::string,chaiscript::exception::eval_error&>
            (&local_ff8);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[7],_true>
            ((pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1178,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&local_ff8,
             (char (*) [7])"reason");
  local_1008.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)exception::eval_error::pretty_print_abi_cxx11_;
  local_1008.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string(chaiscript::exception::eval_error::*)()const,false,true,false,false,std::__cxx11::string,chaiscript::exception::eval_error_const&>
            (&local_1188);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[13],_true>
            (&local_1148,&local_1188,(char (*) [13])"pretty_print");
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::exception::eval_error_const&)_1_,false,false,false,true,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,chaiscript::exception::eval_error_const&>
            (&local_f80,&local_2c0);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[11],_true>
            (&local_1118,&local_f80,(char (*) [11])"call_stack");
  __l._M_len = 3;
  __l._M_array = (iterator)local_1178;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_fe0,__l,(allocator_type *)&local_fa0);
  utility::add_class<chaiscript::exception::eval_error,chaiscript::Module>
            (m,&local_1028,&local_fc8,&local_fe0);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_fe0);
  lVar4 = -0x90;
  paVar3 = &local_1118.second.field_2;
  do {
    if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar3->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar3->_M_allocated_capacity)[-2],paVar3->_M_allocated_capacity + 1
                     );
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(&paVar3->_M_allocated_capacity)[-3] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (&paVar3->_M_allocated_capacity)[-3]);
    }
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar3->_M_allocated_capacity + -6);
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0);
  if (local_f80.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f80.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1188.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1188.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_ff8.
      super__Vector_base<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_ff8.
               super__Vector_base<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(&local_fc8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1028._M_dataplus._M_p != paVar2) {
    operator_delete(local_1028._M_dataplus._M_p,local_1028.field_2._M_allocated_capacity + 1);
  }
  local_1028._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1028,"File_Position","");
  dispatch::detail::build_constructor_<chaiscript::File_Position>((_func_File_Position *)&local_fc8)
  ;
  dispatch::detail::build_constructor_<chaiscript::File_Position,int,int>
            ((_func_File_Position_int_int *)
             &local_fc8.
              super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_fc8;
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::vector((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
            *)&local_fe0,__l_00,(allocator_type *)&local_2c0);
  local_f80.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  dispatch::detail::
  make_callable_impl<int_chaiscript::File_Position::*,true,true,true,false,int,chaiscript::File_Position&>
            (&local_1188);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[5],_true>
            ((pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1178,&local_1188,(char (*) [5])"line");
  local_f90.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&DAT_00000004;
  dispatch::detail::
  make_callable_impl<int_chaiscript::File_Position::*,true,true,true,false,int,chaiscript::File_Position&>
            (&local_1008);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[7],_true>
            (&local_1148,&local_1008,(char (*) [7])"column");
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_1178;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_ff8,__l_01,(allocator_type *)&local_fa0);
  utility::add_class<chaiscript::File_Position,chaiscript::Module>
            (m,&local_1028,
             (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
              *)&local_fe0,&local_ff8);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_ff8);
  lVar4 = -0x60;
  paVar3 = &local_1148.second.field_2;
  do {
    if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar3->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar3->_M_allocated_capacity)[-2],paVar3->_M_allocated_capacity + 1
                     );
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(&paVar3->_M_allocated_capacity)[-3] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (&paVar3->_M_allocated_capacity)[-3]);
    }
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar3->_M_allocated_capacity + -6);
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0);
  if (local_1008.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1008.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1188.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1188.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
             *)&local_fe0);
  lVar4 = 0x20;
  do {
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&local_fe0.
                       super__Vector_base<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar4);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1028._M_dataplus._M_p != paVar2) {
    operator_delete(local_1028._M_dataplus._M_p,local_1028.field_2._M_allocated_capacity + 1);
  }
  local_1028._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1028,"AST_Node","");
  local_fc8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_fc8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_fc8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = 0x10;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string_const_chaiscript::AST_Node::*,true,true,true,false,std::__cxx11::string_const,chaiscript::AST_Node&>
            (&local_ff8);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[5],_true>
            ((pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1178,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&local_ff8,
             (char (*) [5])"text");
  local_60 = 8;
  dispatch::detail::
  make_callable_impl<chaiscript::AST_Node_Type_const_chaiscript::AST_Node::*,true,true,true,false,chaiscript::AST_Node_Type_const,chaiscript::AST_Node&>
            (&local_1188);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[11],_true>
            (&local_1148,&local_1188,(char (*) [11])"identifier");
  local_f80.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)AST_Node::filename_abi_cxx11_;
  local_f80.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string_const&(chaiscript::AST_Node::*)()noexcept_const,true,true,false,false,std::__cxx11::string_const&,chaiscript::AST_Node_const&>
            (&local_1008);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[9],_true>
            (&local_1118,&local_1008,(char (*) [9])"filename");
  local_2c0 = AST_Node::start;
  local_2b8 = 0;
  dispatch::detail::
  make_callable_impl<chaiscript::File_Position_const&(chaiscript::AST_Node::*)()noexcept_const,true,true,false,false,chaiscript::File_Position_const&,chaiscript::AST_Node_const&>
            (&local_f90);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[6],_true>
            (&local_10e8,&local_f90,(char (*) [6])"start");
  local_40 = AST_Node::end;
  local_38 = 0;
  dispatch::detail::
  make_callable_impl<chaiscript::File_Position_const&(chaiscript::AST_Node::*)()noexcept_const,true,true,false,false,chaiscript::File_Position_const&,chaiscript::AST_Node_const&>
            (&local_fa0);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[4],_true>
            (&local_10b8,&local_fa0,(char (*) [4])0x384e78);
  local_50 = AST_Node::to_string;
  local_48 = 0;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string(chaiscript::AST_Node::*)(std::__cxx11::string_const&)const,false,true,false,false,std::__cxx11::string,chaiscript::AST_Node_const&,std::__cxx11::string_const&>
            (&local_f60);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[10],_true>
            (&local_1088,&local_f60,(char (*) [10])"to_string");
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::AST_Node_const&)_1_,false,false,false,true,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,chaiscript::AST_Node_const&>
            (&local_f70,&local_1189);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[9],_true>
            (&local_1058,&local_f70,(char (*) [9])"children");
  __l_02._M_len = 7;
  __l_02._M_array = (iterator)local_1178;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_fe0,__l_02,&local_118a);
  utility::add_class<chaiscript::AST_Node,chaiscript::Module>(m,&local_1028,&local_fc8,&local_fe0);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_fe0);
  lVar4 = -0x150;
  paVar3 = &local_1058.second.field_2;
  do {
    if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar3->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar3->_M_allocated_capacity)[-2],paVar3->_M_allocated_capacity + 1
                     );
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(&paVar3->_M_allocated_capacity)[-3] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (&paVar3->_M_allocated_capacity)[-3]);
    }
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar3->_M_allocated_capacity + -6);
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0);
  if (local_f70.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f70.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_f60.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f60.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_fa0.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_fa0.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_f90.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f90.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1008.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1008.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1188.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1188.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_ff8.
      super__Vector_base<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_ff8.
               super__Vector_base<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(&local_fc8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1028._M_dataplus._M_p != paVar2) {
    operator_delete(local_1028._M_dataplus._M_p,local_1028.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void bootstrap(Module &m) {
      m.add(user_type<void>(), "void");
      m.add(user_type<bool>(), "bool");
      m.add(user_type<Boxed_Value>(), "Object");
      m.add(user_type<Boxed_Number>(), "Number");
      m.add(user_type<Proxy_Function>(), "Function");
      m.add(user_type<dispatch::Assignable_Proxy_Function>(), "Assignable_Function");
      m.add(user_type<std::exception>(), "exception");

      m.add(fun(&dispatch::Proxy_Function_Base::get_arity), "get_arity");
      m.add(fun(&dispatch::Proxy_Function_Base::operator==), "==");

      m.add(fun(return_boxed_value_vector(&dispatch::Proxy_Function_Base::get_param_types)), "get_param_types");
      m.add(fun(return_boxed_value_vector(&dispatch::Proxy_Function_Base::get_contained_functions)), "get_contained_functions");

      m.add(fun([](const std::exception &e) { return std::string(e.what()); }), "what");

      m.add(user_type<std::out_of_range>(), "out_of_range");
      m.add(user_type<std::logic_error>(), "logic_error");
      m.add(chaiscript::base_class<std::exception, std::logic_error>());
      m.add(chaiscript::base_class<std::logic_error, std::out_of_range>());
      m.add(chaiscript::base_class<std::exception, std::out_of_range>());

      m.add(user_type<std::runtime_error>(), "runtime_error");
      m.add(chaiscript::base_class<std::exception, std::runtime_error>());

      m.add(constructor<std::runtime_error(const std::string &)>(), "runtime_error");

      m.add(user_type<dispatch::Dynamic_Object>(), "Dynamic_Object");
      m.add(constructor<dispatch::Dynamic_Object(const std::string &)>(), "Dynamic_Object");
      m.add(constructor<dispatch::Dynamic_Object()>(), "Dynamic_Object");
      m.add(fun(&dispatch::Dynamic_Object::get_type_name), "get_type_name");
      m.add(fun(&dispatch::Dynamic_Object::get_attrs), "get_attrs");
      m.add(fun(&dispatch::Dynamic_Object::set_explicit), "set_explicit");
      m.add(fun(&dispatch::Dynamic_Object::is_explicit), "is_explicit");
      m.add(fun(&dispatch::Dynamic_Object::has_attr), "has_attr");

      m.add(fun(static_cast<Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &)>(&dispatch::Dynamic_Object::get_attr)), "get_attr");
      m.add(fun(static_cast<const Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &) const>(&dispatch::Dynamic_Object::get_attr)),
            "get_attr");

      m.add(fun(static_cast<Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &)>(&dispatch::Dynamic_Object::method_missing)),
            "method_missing");
      m.add(fun(static_cast<const Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &) const>(
                &dispatch::Dynamic_Object::method_missing)),
            "method_missing");

      m.add(fun(static_cast<Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &)>(&dispatch::Dynamic_Object::get_attr)), "[]");
      m.add(fun(static_cast<const Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &) const>(&dispatch::Dynamic_Object::get_attr)),
            "[]");

      m.eval(R"chaiscript(
          def Dynamic_Object::clone() {
            auto &new_o = Dynamic_Object(this.get_type_name());
            for_each(this.get_attrs(), fun[new_o](x) { new_o.get_attr(x.first) = x.second; } );
            new_o;
          }

          def `=`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()
          {
            for_each(rhs.get_attrs(), fun[lhs](x) { lhs.get_attr(x.first) = clone(x.second); } );
          }

          def `!=`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()
          {
            var rhs_attrs := rhs.get_attrs();
            var lhs_attrs := lhs.get_attrs();

            if (rhs_attrs.size() != lhs_attrs.size()) {
              true;
            } else {
              return any_of(rhs_attrs, fun[lhs](x) { !lhs.has_attr(x.first) || lhs.get_attr(x.first) != x.second; } );
            }
          }

          def `==`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()
          {
            var rhs_attrs := rhs.get_attrs();
            var lhs_attrs := lhs.get_attrs();

            if (rhs_attrs.size() != lhs_attrs.size()) {
              false;
            } else {
              return all_of(rhs_attrs, fun[lhs](x) { lhs.has_attr(x.first) && lhs.get_attr(x.first) == x.second; } );
            }
          }
        )chaiscript");

      m.add(fun(&has_guard), "has_guard");
      m.add(fun(&get_guard), "get_guard");

      m.add(fun(&Boxed_Value::is_undef), "is_var_undef");
      m.add(fun(&Boxed_Value::is_null), "is_var_null");
      m.add(fun(&Boxed_Value::is_const), "is_var_const");
      m.add(fun(&Boxed_Value::is_ref), "is_var_reference");
      m.add(fun(&Boxed_Value::is_pointer), "is_var_pointer");
      m.add(fun(&Boxed_Value::is_return_value), "is_var_return_value");
      m.add(fun(&Boxed_Value::reset_return_value), "reset_var_return_value");
      m.add(fun(&Boxed_Value::is_type), "is_type");
      m.add(fun(&Boxed_Value::get_attr), "get_var_attr");
      m.add(fun(&Boxed_Value::copy_attrs), "copy_var_attrs");
      m.add(fun(&Boxed_Value::clone_attrs), "clone_var_attrs");

      m.add(fun(&Boxed_Value::get_type_info), "get_type_info");
      m.add(user_type<Type_Info>(), "Type_Info");
      m.add(constructor<Type_Info(const Type_Info &)>(), "Type_Info");

      operators::equal<Type_Info>(m);

      m.add(fun(&Type_Info::is_const), "is_type_const");
      m.add(fun(&Type_Info::is_reference), "is_type_reference");
      m.add(fun(&Type_Info::is_void), "is_type_void");
      m.add(fun(&Type_Info::is_undef), "is_type_undef");
      m.add(fun(&Type_Info::is_pointer), "is_type_pointer");
      m.add(fun(&Type_Info::is_arithmetic), "is_type_arithmetic");
      m.add(fun(&Type_Info::name), "cpp_name");
      m.add(fun(&Type_Info::bare_name), "cpp_bare_name");
      m.add(fun(&Type_Info::bare_equal), "bare_equal");

      basic_constructors<bool>("bool", m);
      operators::assign<bool>(m);
      operators::equal<bool>(m);
      operators::not_equal<bool>(m);

      m.add(fun([](const std::string &s) { return s; }), "to_string");
      m.add(fun([](const bool b) { return std::string(b ? "true" : "false"); }), "to_string");
      m.add(fun(&unknown_assign), "=");
      m.add(fun([](const Boxed_Value &bv) { throw bv; }), "throw");

      m.add(fun([](const char c) { return std::string(1, c); }), "to_string");
      m.add(fun(&Boxed_Number::to_string), "to_string");

      bootstrap_pod_type<double>("double", m);
      bootstrap_pod_type<long double>("long_double", m);
      bootstrap_pod_type<float>("float", m);
      bootstrap_pod_type<int>("int", m);
      bootstrap_pod_type<long>("long", m);
      bootstrap_pod_type<unsigned int>("unsigned_int", m);
      bootstrap_pod_type<unsigned long>("unsigned_long", m);
      bootstrap_pod_type<long long>("long_long", m);
      bootstrap_pod_type<unsigned long long>("unsigned_long_long", m);
      bootstrap_pod_type<size_t>("size_t", m);
      bootstrap_pod_type<char>("char", m);
      bootstrap_pod_type<wchar_t>("wchar_t", m);
      bootstrap_pod_type<char16_t>("char16_t", m);
      bootstrap_pod_type<char32_t>("char32_t", m);
      bootstrap_pod_type<std::int8_t>("int8_t", m);
      bootstrap_pod_type<std::int16_t>("int16_t", m);
      bootstrap_pod_type<std::int32_t>("int32_t", m);
      bootstrap_pod_type<std::int64_t>("int64_t", m);
      bootstrap_pod_type<std::uint8_t>("uint8_t", m);
      bootstrap_pod_type<std::uint16_t>("uint16_t", m);
      bootstrap_pod_type<std::uint32_t>("uint32_t", m);
      bootstrap_pod_type<std::uint64_t>("uint64_t", m);

      operators::logical_compliment<bool>(m);

      opers_arithmetic_pod(m);

      m.add(fun(&Build_Info::version_major), "version_major");
      m.add(fun(&Build_Info::version_minor), "version_minor");
      m.add(fun(&Build_Info::version_patch), "version_patch");
      m.add(fun(&Build_Info::version), "version");
      m.add(fun(&Build_Info::compiler_version), "compiler_version");
      m.add(fun(&Build_Info::compiler_name), "compiler_name");
      m.add(fun(&Build_Info::compiler_id), "compiler_id");
      m.add(fun(&Build_Info::debug_build), "debug_build");

      m.add(fun(&print), "print_string");
      m.add(fun(&println), "println_string");

      m.add(dispatch::make_dynamic_proxy_function(&bind_function), "bind");

      m.add(fun(&shared_ptr_unconst_clone<dispatch::Proxy_Function_Base>), "clone");
      m.add(fun(&ptr_assign<std::remove_const<dispatch::Proxy_Function_Base>::type>), "=");
      m.add(fun(&ptr_assign<std::add_const<dispatch::Proxy_Function_Base>::type>), "=");
      m.add(chaiscript::base_class<dispatch::Proxy_Function_Base, dispatch::Assignable_Proxy_Function>());
      m.add(fun([](dispatch::Assignable_Proxy_Function &t_lhs, const std::shared_ptr<const dispatch::Proxy_Function_Base> &t_rhs) {
              t_lhs.assign(t_rhs);
            }),
            "=");

      m.add(fun(&Boxed_Value::type_match), "type_match");

      m.add(chaiscript::fun(&has_parse_tree), "has_parse_tree");
      m.add(chaiscript::fun(&get_parse_tree), "get_parse_tree");

      m.add(chaiscript::base_class<std::runtime_error, chaiscript::exception::eval_error>());
      m.add(chaiscript::base_class<std::exception, chaiscript::exception::eval_error>());

      m.add(chaiscript::user_type<chaiscript::exception::arithmetic_error>(), "arithmetic_error");
      m.add(chaiscript::base_class<std::runtime_error, chaiscript::exception::arithmetic_error>());
      m.add(chaiscript::base_class<std::exception, chaiscript::exception::arithmetic_error>());

      //        chaiscript::bootstrap::standard_library::vector_type<std::vector<std::shared_ptr<chaiscript::AST_Node> >
      //        >("AST_NodeVector", m);

      chaiscript::utility::add_class<chaiscript::exception::eval_error>(m,
                                                                        "eval_error",
                                                                        {},
                                                                        {{fun(&chaiscript::exception::eval_error::reason), "reason"},
                                                                         {fun(&chaiscript::exception::eval_error::pretty_print), "pretty_print"},
                                                                         {fun([](const chaiscript::exception::eval_error &t_eval_error) {
                                                                            std::vector<Boxed_Value> retval;
                                                                            std::transform(t_eval_error.call_stack.begin(),
                                                                                           t_eval_error.call_stack.end(),
                                                                                           std::back_inserter(retval),
                                                                                           &chaiscript::var<const chaiscript::AST_Node_Trace &>);
                                                                            return retval;
                                                                          }),
                                                                          "call_stack"}});

      chaiscript::utility::add_class<chaiscript::File_Position>(m,
                                                                "File_Position",
                                                                {constructor<File_Position()>(), constructor<File_Position(int, int)>()},
                                                                {{fun(&File_Position::line), "line"},
                                                                 {fun(&File_Position::column), "column"}});

      chaiscript::utility::add_class<AST_Node>(m,
                                               "AST_Node",
                                               {},
                                               {{fun(&AST_Node::text), "text"},
                                                {fun(&AST_Node::identifier), "identifier"},
                                                {fun(&AST_Node::filename), "filename"},
                                                {fun(&AST_Node::start), "start"},
                                                {fun(&AST_Node::end), "end"},
                                                {fun(&AST_Node::to_string), "to_string"},
                                                {fun([](const chaiscript::AST_Node &t_node) -> std::vector<Boxed_Value> {
                                                   std::vector<Boxed_Value> retval;
                                                   const auto children = t_node.get_children();
                                                   std::transform(children.begin(),
                                                                  children.end(),
                                                                  std::back_inserter(retval),
                                                                  &chaiscript::var<const std::reference_wrapper<chaiscript::AST_Node> &>);
                                                   return retval;
                                                 }),
                                                 "children"}});
    }